

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O3

bool __thiscall
msgpack::v2::detail::create_object_visitor::visit_bin
          (create_object_visitor *this,char *v,uint32_t size)

{
  object *poVar1;
  zone *pzVar2;
  bool bVar3;
  chunk *pcVar4;
  bin_size_overflow *this_00;
  undefined8 *puVar5;
  object *__dest;
  ulong __n;
  size_t sVar6;
  ulong uVar7;
  
  __n = (ulong)size;
  if ((this->m_limit).bin_ < __n) {
    this_00 = (bin_size_overflow *)__cxa_allocate_exception(0x10);
    v1::bin_size_overflow::bin_size_overflow(this_00,"bin size overflow");
    __cxa_throw(this_00,&v1::bin_size_overflow::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = (this->m_stack).
           super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>._M_impl
           .super__Vector_impl_data._M_finish[-1];
  (poVar1->super_object).type = BIN;
  if ((this->m_func == (unpack_reference_func)0x0) ||
     (bVar3 = (*this->m_func)(BIN,__n,this->m_user_data), !bVar3)) {
    if (v == (char *)0x0) {
      (poVar1->super_object).via.array.ptr = (object *)0x0;
      (poVar1->super_object).via.array.size = 0;
    }
    else {
      pzVar2 = this->m_zone;
      uVar7 = (pzVar2->m_chunk_list).m_free;
      if (uVar7 < __n) {
        sVar6 = pzVar2->m_chunk_size;
        do {
          uVar7 = sVar6;
          if (__n <= sVar6) break;
          bVar3 = 0 < (long)sVar6;
          uVar7 = __n;
          sVar6 = sVar6 * 2;
        } while (bVar3);
        pcVar4 = (chunk *)malloc(uVar7 + 8);
        if (pcVar4 == (chunk *)0x0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = std::ostream::operator<<;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        __dest = (object *)(pcVar4 + 1);
        pcVar4->m_next = (pzVar2->m_chunk_list).m_head;
        (pzVar2->m_chunk_list).m_head = pcVar4;
      }
      else {
        __dest = (object *)(pzVar2->m_chunk_list).m_ptr;
      }
      (pzVar2->m_chunk_list).m_free = uVar7 - __n;
      (pzVar2->m_chunk_list).m_ptr = (char *)((long)&(__dest->super_object).type + __n);
      memcpy(__dest,v,__n);
      (poVar1->super_object).via.array.ptr = __dest;
      (poVar1->super_object).via.array.size = size;
    }
  }
  else {
    (poVar1->super_object).via.str.ptr = v;
    (poVar1->super_object).via.array.size = size;
    this->m_referenced = true;
  }
  return true;
}

Assistant:

bool visit_bin(const char* v, uint32_t size) {
        MSGPACK_ASSERT(v || size == 0);
        if (size > m_limit.bin()) throw msgpack::bin_size_overflow("bin size overflow");
        msgpack::object* obj = m_stack.back();
        obj->type = msgpack::type::BIN;
        if (m_func && m_func(obj->type, size, m_user_data)) {
            obj->via.bin.ptr = v;
            obj->via.bin.size = size;
            set_referenced(true);
        }
        else {
            if (v) {
                char* tmp = static_cast<char*>(zone().allocate_align(size, MSGPACK_ZONE_ALIGNOF(char)));
                std::memcpy(tmp, v, size);
                obj->via.bin.ptr = tmp;
                obj->via.bin.size = size;
            }
            else {
                obj->via.bin.ptr = MSGPACK_NULLPTR;
                obj->via.bin.size = 0;
            }
        }
        return true;
    }